

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.h
# Opt level: O3

void __thiscall Argument::Argument(Argument *this,int argc,char **argv)

{
  string *psVar1;
  uint uVar2;
  pointer pcVar3;
  ulong __val;
  bool bVar4;
  double dVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char cVar6;
  int iVar7;
  long lVar8;
  ulonglong uVar9;
  uint *puVar10;
  long *plVar11;
  undefined8 uVar12;
  ulong uVar13;
  size_type *psVar14;
  double dVar15;
  char cVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  _Alloc_hider _Var18;
  void *pvVar19;
  char *pcVar20;
  float fVar21;
  string value;
  string param;
  string __str;
  string postfix;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  char *local_360;
  undefined8 local_358;
  char local_350;
  undefined7 uStack_34f;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330;
  undefined7 uStack_32f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  double local_318;
  char **local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  long *local_298;
  uint local_290;
  long local_288 [2];
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  this->_func = 2;
  this->_seedsize = 0x32;
  this->_samplesize = 1000;
  this->_probEdge = 0.1;
  this->_budget = 5000.0;
  this->_eps = 0.1;
  this->_feps = 0.1;
  this->_delta = -1.0;
  *(undefined4 *)&this->_percent = 0x74a771d;
  *(undefined4 *)((long)&this->_percent + 4) = 0x3fefffeb;
  *(undefined4 *)&this->_budpercent = 0xeb1c432d;
  *(undefined4 *)((long)&this->_budpercent + 4) = 0x3f1a36e2;
  this->_normalpha = 0.2;
  this->_model = IC;
  local_2b8 = &this->_graphname;
  local_2d8 = &(this->_graphname).field_2;
  (this->_graphname)._M_dataplus._M_p = (pointer)local_2d8;
  local_310 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"facebook","");
  psVar1 = &this->_mode;
  local_2e0 = &(this->_mode).field_2;
  (this->_mode)._M_dataplus._M_p = (pointer)local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"g","");
  local_2c0 = &this->_dir;
  local_2e8 = &(this->_dir).field_2;
  (this->_dir)._M_dataplus._M_p = (pointer)local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"graphInfo","");
  local_2c8 = &this->_resultFolder;
  local_2f0 = &(this->_resultFolder).field_2;
  (this->_resultFolder)._M_dataplus._M_p = (pointer)local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"result","");
  local_320 = &this->_algName;
  local_2f8 = &(this->_algName).field_2;
  (this->_algName)._M_dataplus._M_p = (pointer)local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"opim-b","");
  local_2d0 = &this->_probDist;
  local_300 = &(this->_probDist).field_2;
  (this->_probDist)._M_dataplus._M_p = (pointer)local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"load","");
  local_368 = &this->_outFileName;
  local_308 = &(this->_outFileName).field_2;
  (this->_outFileName)._M_dataplus._M_p = (pointer)local_308;
  (this->_outFileName)._M_string_length = 0;
  (this->_outFileName).field_2._M_local_buf[0] = '\0';
  local_340 = &local_330;
  local_338 = 0;
  local_330 = 0;
  local_360 = &local_350;
  local_358 = 0;
  local_350 = '\0';
  if (1 < argc) {
    dVar15 = 4.94065645841247e-324;
    local_318 = (double)(ulong)(uint)argc;
    do {
      if (*local_310[(long)dVar15] != '-') break;
      std::__cxx11::string::string
                ((string *)&local_388,local_310[(long)dVar15],(allocator *)&local_298);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_1b8._M_local_buf,(string *)&local_388,_S_out|_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b8._M_local_buf,(string *)&local_340,'=');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b8._M_local_buf,(string *)&local_360,'=');
      iVar7 = std::__cxx11::string::compare((char *)&local_340);
      pcVar20 = local_360;
      if (iVar7 == 0) {
        puVar10 = (uint *)__errno_location();
        uVar2 = *puVar10;
        pvVar19 = (void *)(ulong)uVar2;
        *puVar10 = 0;
        lVar8 = strtol(pcVar20,(char **)&local_388,10);
        if (local_388._M_dataplus._M_p == pcVar20) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*puVar10 != 0x22)) {
          if (*puVar10 == 0) {
            *puVar10 = uVar2;
          }
          this->_func = (int)lVar8;
          goto LAB_001184b0;
        }
        std::__throw_out_of_range("stoi");
LAB_00118ba1:
        std::__throw_out_of_range("stoi");
LAB_00118bad:
        std::__throw_invalid_argument("stoi");
LAB_00118bb9:
        std::__throw_invalid_argument("stoull");
LAB_00118bc5:
        std::__throw_invalid_argument("stof");
LAB_00118bd1:
        std::__throw_out_of_range("stoull");
LAB_00118bdd:
        std::__throw_invalid_argument("stod");
LAB_00118be9:
        std::__throw_out_of_range("stof");
LAB_00118bf5:
        std::__throw_invalid_argument("stod");
LAB_00118c01:
        std::__throw_out_of_range("stod");
LAB_00118c0d:
        std::__throw_invalid_argument("stod");
LAB_00118c19:
        std::__throw_out_of_range("stod");
LAB_00118c25:
        std::__throw_invalid_argument("stod");
LAB_00118c31:
        std::__throw_out_of_range("stod");
LAB_00118c3d:
        std::__throw_invalid_argument("stod");
LAB_00118c49:
        std::__throw_out_of_range("stod");
LAB_00118c55:
        std::__throw_invalid_argument("stod");
LAB_00118c61:
        std::__throw_out_of_range("stod");
LAB_00118c6d:
        uVar12 = std::__throw_out_of_range("stod");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_1b8) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((uint *)local_258._M_dataplus._M_p != puVar10) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((void *)local_1b8._M_allocated_capacity != pvVar19) {
          operator_delete((void *)local_1b8._M_allocated_capacity,
                          local_1a8[0]._M_allocated_capacity + 1);
        }
        if (local_360 != &local_350) {
          operator_delete(local_360,CONCAT71(uStack_34f,local_350) + 1);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
        }
        plVar11 = (long *)(local_368->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_308) {
          operator_delete(plVar11,local_308->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2d0->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_300) {
          operator_delete(plVar11,local_300->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_320->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_2f8) {
          operator_delete(plVar11,local_2f8->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2c8->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_2f0) {
          operator_delete(plVar11,local_2f0->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2c0->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_2e8) {
          operator_delete(plVar11,local_2e8->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(psVar1->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_2e0) {
          operator_delete(plVar11,local_2e0->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2b8->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_2d8) {
          operator_delete(plVar11,local_2d8->_M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar12);
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_340);
      pcVar20 = local_360;
      if (iVar7 == 0) {
        puVar10 = (uint *)__errno_location();
        uVar2 = *puVar10;
        pvVar19 = (void *)(ulong)uVar2;
        *puVar10 = 0;
        lVar8 = strtol(pcVar20,(char **)&local_388,10);
        if (local_388._M_dataplus._M_p != pcVar20) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*puVar10 != 0x22)) {
            if (*puVar10 == 0) {
              *puVar10 = uVar2;
            }
            this->_seedsize = (int)lVar8;
            goto LAB_001184b0;
          }
          goto LAB_00118ba1;
        }
        goto LAB_00118bad;
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_340);
      pcVar20 = local_360;
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare((char *)&local_340);
        pcVar20 = local_360;
        if (iVar7 == 0) {
          puVar10 = (uint *)__errno_location();
          uVar2 = *puVar10;
          pvVar19 = (void *)(ulong)uVar2;
          *puVar10 = 0;
          fVar21 = strtof(pcVar20,(char **)&local_388);
          if (local_388._M_dataplus._M_p == pcVar20) goto LAB_00118bc5;
          if (*puVar10 == 0) {
            *puVar10 = uVar2;
LAB_001182e5:
            this->_probEdge = fVar21;
            goto LAB_001184b0;
          }
          if (*puVar10 != 0x22) goto LAB_001182e5;
          goto LAB_00118be9;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_340);
        pcVar20 = local_360;
        if (iVar7 == 0) {
          puVar10 = (uint *)__errno_location();
          uVar2 = *puVar10;
          pvVar19 = (void *)(ulong)uVar2;
          *puVar10 = 0;
          dVar5 = strtod(pcVar20,(char **)&local_388);
          if (local_388._M_dataplus._M_p == pcVar20) goto LAB_00118bdd;
          if (*puVar10 == 0) {
            *puVar10 = uVar2;
LAB_00118335:
            this->_eps = dVar5;
            goto LAB_001184b0;
          }
          if (*puVar10 != 0x22) goto LAB_00118335;
          goto LAB_00118c01;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_340);
        pcVar20 = local_360;
        if (iVar7 == 0) {
          puVar10 = (uint *)__errno_location();
          uVar2 = *puVar10;
          pvVar19 = (void *)(ulong)uVar2;
          *puVar10 = 0;
          dVar5 = strtod(pcVar20,(char **)&local_388);
          if (local_388._M_dataplus._M_p == pcVar20) goto LAB_00118bf5;
          if (*puVar10 == 0) {
            *puVar10 = uVar2;
LAB_00118385:
            this->_feps = dVar5;
            goto LAB_001184b0;
          }
          if (*puVar10 != 0x22) goto LAB_00118385;
          goto LAB_00118c19;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_340);
        pcVar20 = local_360;
        if (iVar7 == 0) {
          puVar10 = (uint *)__errno_location();
          uVar2 = *puVar10;
          pvVar19 = (void *)(ulong)uVar2;
          *puVar10 = 0;
          dVar5 = strtod(pcVar20,(char **)&local_388);
          if (local_388._M_dataplus._M_p == pcVar20) goto LAB_00118c0d;
          if (*puVar10 == 0) {
            *puVar10 = uVar2;
LAB_001183d5:
            this->_delta = dVar5;
            goto LAB_001184b0;
          }
          if (*puVar10 != 0x22) goto LAB_001183d5;
          goto LAB_00118c31;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_340);
        pcVar20 = local_360;
        if (iVar7 == 0) {
          puVar10 = (uint *)__errno_location();
          uVar2 = *puVar10;
          pvVar19 = (void *)(ulong)uVar2;
          *puVar10 = 0;
          dVar5 = strtod(pcVar20,(char **)&local_388);
          if (local_388._M_dataplus._M_p == pcVar20) goto LAB_00118c25;
          if (*puVar10 == 0) {
            *puVar10 = uVar2;
LAB_00118425:
            this->_budget = dVar5;
            goto LAB_001184b0;
          }
          if (*puVar10 != 0x22) goto LAB_00118425;
          goto LAB_00118c49;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_340);
        pcVar20 = local_360;
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare((char *)&local_340);
          pcVar20 = local_360;
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)&local_340);
            if (iVar7 == 0) {
              iVar7 = std::__cxx11::string::compare((char *)&local_360);
              this->_model = (uint)(iVar7 == 0);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_340);
              pbVar17 = local_2b8;
              if (((((iVar7 == 0) ||
                    (iVar7 = std::__cxx11::string::compare((char *)&local_340), pbVar17 = psVar1,
                    iVar7 == 0)) ||
                   (iVar7 = std::__cxx11::string::compare((char *)&local_340), pbVar17 = local_2c0,
                   iVar7 == 0)) ||
                  ((iVar7 = std::__cxx11::string::compare((char *)&local_340), pbVar17 = local_2c8,
                   iVar7 == 0 ||
                   (iVar7 = std::__cxx11::string::compare((char *)&local_340), pbVar17 = local_320,
                   iVar7 == 0)))) ||
                 (iVar7 = std::__cxx11::string::compare((char *)&local_340), pbVar17 = local_2d0,
                 iVar7 == 0)) {
                std::__cxx11::string::_M_assign((string *)pbVar17);
              }
            }
            goto LAB_001184b0;
          }
          puVar10 = (uint *)__errno_location();
          uVar2 = *puVar10;
          pvVar19 = (void *)(ulong)uVar2;
          *puVar10 = 0;
          dVar5 = strtod(pcVar20,(char **)&local_388);
          if (local_388._M_dataplus._M_p != pcVar20) {
            if (*puVar10 == 0) {
              *puVar10 = uVar2;
            }
            else if (*puVar10 == 0x22) goto LAB_00118c6d;
            this->_normalpha = dVar5;
            goto LAB_001184b0;
          }
          goto LAB_00118c55;
        }
        puVar10 = (uint *)__errno_location();
        uVar2 = *puVar10;
        pvVar19 = (void *)(ulong)uVar2;
        *puVar10 = 0;
        dVar5 = strtod(pcVar20,(char **)&local_388);
        if (local_388._M_dataplus._M_p == pcVar20) goto LAB_00118c3d;
        if (*puVar10 == 0) {
          *puVar10 = uVar2;
LAB_00118472:
          this->_budpercent = dVar5;
          goto LAB_001184b0;
        }
        if (*puVar10 != 0x22) goto LAB_00118472;
        goto LAB_00118c61;
      }
      puVar10 = (uint *)__errno_location();
      uVar2 = *puVar10;
      pvVar19 = (void *)(ulong)uVar2;
      *puVar10 = 0;
      uVar9 = strtoull(pcVar20,(char **)&local_388,10);
      if (local_388._M_dataplus._M_p == pcVar20) goto LAB_00118bb9;
      if (*puVar10 != 0) {
        if (*puVar10 != 0x22) goto LAB_00118297;
        goto LAB_00118bd1;
      }
      *puVar10 = uVar2;
LAB_00118297:
      this->_samplesize = uVar9;
LAB_001184b0:
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8._M_local_buf);
      std::ios_base::~ios_base(local_138);
      dVar15 = (double)((long)dVar15 + 1);
    } while (local_318 != dVar15);
  }
  local_1b8._M_allocated_capacity = (size_type)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"_minBound","");
  iVar7 = std::__cxx11::string::compare((char *)psVar1);
  pcVar20 = "_vanilla";
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)psVar1), iVar7 == 0)) {
LAB_00118569:
    std::__cxx11::string::_M_replace((ulong)&local_1b8,0,(char *)local_1b8._8_8_,(ulong)pcVar20);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)psVar1);
    pcVar20 = "_lastBound";
    if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)psVar1), iVar7 == 0))
    goto LAB_00118569;
  }
  pbVar17 = local_320;
  iVar7 = std::__cxx11::string::compare((char *)local_320);
  if ((((((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)) ||
        (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)) ||
       (((iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0 ||
         (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)) ||
        ((iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0 ||
         ((iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0 ||
          (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)))))))) ||
      (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)) ||
     ((((iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0 ||
        (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)) ||
       (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)) ||
      ((iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0 ||
       (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)))))) {
    pcVar3 = (this->_graphname)._M_dataplus._M_p;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar3,pcVar3 + (this->_graphname)._M_string_length);
    std::operator+(&local_1d8,pbVar17,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8);
    local_310 = (char **)this->_budpercent;
    local_318 = this->_normalpha;
    local_2a0 = this->_percent;
    local_2a8 = this->_eps;
    local_2b0 = this->_feps;
    pcVar3 = (this->_probDist)._M_dataplus._M_p;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar3,pcVar3 + (this->_probDist)._M_string_length);
    IOcontroller::get_out_file_name_budget
              (&local_388,&local_218,&local_1d8,(double)local_310,local_318,local_2a0,local_2a8,
               local_2b0,&local_238,this->_probEdge);
    std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    _Var18._M_p = local_218._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_00118972;
  }
  else {
    pcVar3 = (this->_graphname)._M_dataplus._M_p;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar3,pcVar3 + (this->_graphname)._M_string_length);
    std::operator+(&local_1f8,pbVar17,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8);
    iVar7 = this->_seedsize;
    pcVar3 = (this->_probDist)._M_dataplus._M_p;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,pcVar3,pcVar3 + (this->_probDist)._M_string_length);
    IOcontroller::get_out_file_name
              (&local_388,&local_258,&local_1f8,iVar7,&local_278,this->_probEdge);
    std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_218.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
    _Var18._M_p = local_258._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p == &local_258.field_2) goto LAB_00118972;
  }
  operator_delete(_Var18._M_p,local_218.field_2._M_allocated_capacity + 1);
LAB_00118972:
  this_00 = local_368;
  if (this->_model == LT) {
    std::operator+(&local_388,"LT_",local_368);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)pbVar17);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar17), iVar7 == 0)) {
    pbVar17 = local_368;
    __val = this->_samplesize;
    cVar16 = '\x01';
    if (9 < __val) {
      uVar13 = __val;
      cVar6 = '\x04';
      do {
        cVar16 = cVar6;
        if (uVar13 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_00118a49;
        }
        if (uVar13 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_00118a49;
        }
        if (uVar13 < 10000) goto LAB_00118a49;
        bVar4 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar16 + '\x04';
      } while (bVar4);
      cVar16 = cVar16 + '\x01';
    }
LAB_00118a49:
    local_298 = local_288;
    std::__cxx11::string::_M_construct((ulong)&local_298,cVar16);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_298,local_290,__val);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x132cf7);
    psVar14 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_388.field_2._M_allocated_capacity = *psVar14;
      local_388.field_2._8_8_ = plVar11[3];
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    }
    else {
      local_388.field_2._M_allocated_capacity = *psVar14;
      local_388._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_388._M_string_length = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::_M_append((char *)pbVar17,(ulong)local_388._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_allocated_capacity != local_1a8) {
    operator_delete((void *)local_1b8._M_allocated_capacity,local_1a8[0]._M_allocated_capacity + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT71(uStack_34f,local_350) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
  }
  return;
}

Assistant:

Argument(int argc, char* argv[])
    {
        std::string param, value;
        for (int ind = 1; ind < argc; ind++)
        {
            if (argv[ind][0] != '-') {
                break;
            }
            std::stringstream sstr(argv[ind]);
            getline(sstr, param, '=');
            getline(sstr, value, '=');
            if (!param.compare("-func")) {
                _func = stoi(value);
            }
            else if (!param.compare("-seedsize")) {
                _seedsize = stoi(value);
            }
            else if (!param.compare("-samplesize")) {
                _samplesize = stoull(value);
            }
            else if (!param.compare("-pedge")) {
                _probEdge = stof(value);
            }
            else if (!param.compare("-eps")) {
                _eps = stod(value);
            }
            else if (!param.compare("-feps")) {
                _feps = stod(value);
            }
            else if (!param.compare("-delta")) {
                _delta = stod(value);
            }
            else if (!param.compare("-budget")) {
                _budget = stod(value);
            }
            else if (!param.compare("-budper")) {
                _budpercent = stod(value);
            }
            else if (!param.compare("-nalpha")) {
                _normalpha = stod(value);
            }
            else if (!param.compare("-model")) {
                _model = value == "LT" ? LT : IC;
            }
            else if (!param.compare("-gname")) {
                _graphname = value;
            }
            else if (!param.compare("-mode")) {
                _mode = value;
            }
            else if (!param.compare("-dir")) {
                _dir = value;
            }
            else if (!param.compare("-outpath")) {
                _resultFolder = value;
            }
            else if (!param.compare("-alg")) {
                _algName = value;
            }
            else if (!param.compare("-pdist")) {
                _probDist = value;
            }
        }
        std::string postfix = "_minBound"; // Default is to use the minimum upper bound among all the rounds
        if (_mode == "0" || _mode == "vanilla") {
            postfix = "_vanilla";
        }
        else if (_mode == "1" || _mode == "last") {
            postfix = "_lastBound";
        }
        if (_algName == "opim-b" || _algName == "OPIM-B" ||
            _algName == "opim-b-n" || _algName == "OPIM-B-N" ||
            _algName == "opim-b-fe" || _algName == "OPIM-B-FE" ||
            _algName == "opim-ba" || _algName == "OPIM-BA" ||
            _algName == "opim-b-fa" || _algName == "OPIM-B-FA" ||
            _algName == "opim-a" || _algName == "OPIM-A" ||
            _algName == "opim-a-f" || _algName == "OPIM-A-F") {
            _outFileName = TIO::get_out_file_name_budget(_graphname, _algName + postfix, _budpercent,
                    _normalpha, _percent, _eps, _feps, _probDist, _probEdge);
        }
        else {
            _outFileName = TIO::get_out_file_name(_graphname, _algName + postfix, _seedsize, _probDist, _probEdge);
        }
        if (_model == LT) {
            _outFileName = "LT_" + _outFileName;
        }
        if (_algName == "OPIM" || _algName == "opim") {
            _outFileName += "_s" + std::to_string(_samplesize);
        }
    }